

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integerCoding.cpp
# Opt level: O1

size_t tinyusdz::Usd_IntegerCompression::DecompressFromBuffer
                 (char *compressed,size_t compressedSize,int32_t *ints,size_t numInts,string *err,
                 char *workingSpace)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  ulong maxOutputSize;
  int *piVar6;
  uint uVar7;
  int iVar8;
  byte *pbVar9;
  int *local_40;
  
  if (numInts == 0) {
    maxOutputSize = 0;
  }
  else {
    maxOutputSize = (numInts * 2 + 7 >> 3) + numInts * 4 + 4;
  }
  if (workingSpace == (char *)0x0) {
    workingSpace = (char *)operator_new__(maxOutputSize);
    local_40 = (int *)workingSpace;
  }
  else {
    local_40 = (int *)0x0;
  }
  sVar3 = LZ4Compression::DecompressFromBuffer
                    (compressed,workingSpace,compressedSize,maxOutputSize,err);
  if (sVar3 == 0) {
    if (local_40 != (int *)0x0) {
      operator_delete__(local_40);
    }
    return 0;
  }
  iVar2 = *(int *)workingSpace;
  pbVar9 = (byte *)((long)workingSpace + 4);
  piVar6 = (int *)((long)workingSpace + (numInts * 2 + 7 >> 3) + 4);
  if (3 < numInts) {
    iVar5 = 0;
    do {
      bVar1 = *pbVar9;
      iVar4 = 0;
      do {
        uVar7 = (3 << ((byte)iVar4 & 0x1f) & (uint)bVar1) >> ((byte)iVar4 & 0x1f);
        if (uVar7 == 3) {
          iVar8 = *piVar6;
          piVar6 = piVar6 + 1;
        }
        else if (uVar7 == 2) {
          iVar8 = *piVar6;
          piVar6 = (int *)((long)piVar6 + 2);
          iVar8 = (int)(short)iVar8;
        }
        else {
          iVar8 = iVar2;
          if (uVar7 == 1) {
            iVar8 = *piVar6;
            piVar6 = (int *)((long)piVar6 + 1);
            iVar8 = (int)(char)iVar8;
          }
        }
        iVar5 = iVar5 + iVar8;
        *ints = iVar5;
        ints = ints + 1;
        iVar4 = iVar4 + 2;
      } while (iVar4 != 8);
      pbVar9 = pbVar9 + 1;
      numInts = numInts - 4;
    } while (3 < numInts);
  }
  sVar3 = (*(code *)(&DAT_001124fc + *(int *)(&DAT_001124fc + numInts * 4)))(local_40);
  return sVar3;
}

Assistant:

size_t
Usd_IntegerCompression::DecompressFromBuffer(
    char const *compressed, size_t compressedSize,
    int32_t *ints, size_t numInts, std::string *err, char *workingSpace)
{
    return _DecompressIntegers(compressed, compressedSize,
                               ints, numInts, err, workingSpace);
}